

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

bool __thiscall
QCommandLineParserPrivate::registerFoundOption(QCommandLineParserPrivate *this,QString *optionName)

{
  bool bVar1;
  QStringList *this_00;
  
  bVar1 = QHash<QString,_long_long>::contains(&this->nameHash,optionName);
  this_00 = &this->optionNames;
  if (!bVar1) {
    this_00 = &this->unknownOptionNames;
  }
  QList<QString>::emplaceBack<QString_const&>(this_00,optionName);
  return bVar1;
}

Assistant:

bool QCommandLineParserPrivate::registerFoundOption(const QString &optionName)
{
    if (nameHash.contains(optionName)) {
        optionNames.append(optionName);
        return true;
    } else {
        unknownOptionNames.append(optionName);
        return false;
    }
}